

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolDHCP.cpp
# Opt level: O3

void __thiscall
ProtocolDHCP::SendRequest
          (ProtocolDHCP *this,uint8_t messageType,uint8_t *serverAddress,uint8_t *requestAddress)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  DataBuffer *buffer;
  uint64_t uVar4;
  size_t sVar5;
  long lVar6;
  undefined4 extraout_var;
  uint8_t targetIP [4];
  uint8_t sourceIP [4];
  uint8_t local_38 [8];
  
  buffer = ProtocolUDP::GetTxBuffer(this->UDP,this->MAC);
  if (buffer != (DataBuffer *)0x0) {
    uVar4 = osTime::GetTime();
    this->PendingXID = (int)uVar4;
    sVar5 = Pack8(buffer->Packet,(ulong)buffer->Length,'\x01');
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer->Packet,sVar5 & 0xffff,'\x01');
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer->Packet,sVar5 & 0xffff,'\x06');
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer->Packet,sVar5 & 0xffff,'\0');
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer->Packet,sVar5 & 0xffff,this->PendingXID);
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack16(buffer->Packet,sVar5 & 0xffff,0);
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack16(buffer->Packet,sVar5 & 0xffff,0x8000);
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer->Packet,sVar5 & 0xffff,0);
    buffer->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer->Packet,sVar5 & 0xffff,0);
    buffer->Length = (uint16_t)sVar5;
    if (serverAddress == (uint8_t *)0x0) {
      sVar5 = Pack32(buffer->Packet,sVar5 & 0xffff,0);
      uVar2 = (ushort)sVar5;
      buffer->Length = uVar2;
    }
    else {
      lVar6 = 0;
      do {
        uVar1 = serverAddress[lVar6];
        uVar2 = buffer->Length;
        buffer->Length = uVar2 + 1;
        buffer->Packet[uVar2] = uVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      uVar2 = buffer->Length;
    }
    lVar6 = 0;
    sVar5 = Pack32(buffer->Packet,(ulong)uVar2,0);
    buffer->Length = (uint16_t)sVar5;
    do {
      iVar3 = (*this->MAC->_vptr_InterfaceMAC[5])();
      uVar1 = *(uint8_t *)(CONCAT44(extraout_var,iVar3) + lVar6);
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = uVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar3 = 10;
    do {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 0x40;
    do {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 0x80;
    do {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    sVar5 = Pack32(buffer->Packet,(ulong)buffer->Length,0x63825363);
    buffer->Length = (short)sVar5 + 1;
    buffer->Packet[sVar5 & 0xffff] = '5';
    uVar2 = buffer->Length;
    buffer->Length = uVar2 + 1;
    buffer->Packet[uVar2] = '\x01';
    uVar2 = buffer->Length;
    buffer->Length = uVar2 + 1;
    buffer->Packet[uVar2] = messageType;
    if (requestAddress != (uint8_t *)0x0) {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '2';
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\x04';
      lVar6 = 0;
      do {
        uVar1 = requestAddress[lVar6];
        uVar2 = buffer->Length;
        buffer->Length = uVar2 + 1;
        buffer->Packet[uVar2] = uVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
    if (serverAddress != (uint8_t *)0x0) {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '6';
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\x05';
      lVar6 = 0;
      do {
        uVar1 = serverAddress[lVar6];
        uVar2 = buffer->Length;
        buffer->Length = uVar2 + 1;
        buffer->Packet[uVar2] = uVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
    uVar2 = buffer->Length;
    buffer->Length = uVar2 + 1;
    buffer->Packet[uVar2] = 0xff;
    iVar3 = 8;
    do {
      uVar2 = buffer->Length;
      buffer->Length = uVar2 + 1;
      buffer->Packet[uVar2] = '\0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    local_38[0] = 0xff;
    local_38[1] = 0xff;
    local_38[2] = 0xff;
    local_38[3] = 0xff;
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    ProtocolUDP::Transmit(this->UDP,buffer,local_38,0x43,local_38 + 4,0x44);
  }
  return;
}

Assistant:

void ProtocolDHCP::SendRequest(uint8_t messageType,
                               const uint8_t* serverAddress,
                               const uint8_t* requestAddress)
{
    DataBuffer* buffer = UDP.GetTxBuffer(&MAC);
    int i;

    if (buffer)
    {
        PendingXID = (uint32_t)osTime::GetTime();

        buffer->Length = Pack8(buffer->Packet, buffer->Length, 1);           // op
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 1);           // htype
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 6);           // hlen
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 0);           // hops
        buffer->Length = Pack32(buffer->Packet, buffer->Length, PendingXID); // xid
        buffer->Length = Pack16(buffer->Packet, buffer->Length, 0);          // secs
        buffer->Length = Pack16(buffer->Packet, buffer->Length, 0x8000);     // flags
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0);          // (Client IP address)
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0);          // (Your IP address)
        if (serverAddress != nullptr)
        {
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = serverAddress[i]; // (Server IP address)
            }
        }
        else
        {
            buffer->Length = Pack32(buffer->Packet, buffer->Length, 0); // (Your IP address)
        }
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0); // (Gateway IP address)
        for (i = 0; i < 6; i++)
        {
            buffer->Packet[buffer->Length++] = MAC.GetUnicastAddress()[i];
        }
        for (; i < 16; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // pad chaddr to 16 bytes
        }
        for (i = 0; i < 64; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // sname
        }
        for (i = 0; i < 128; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // file
        }
        buffer->Length = Pack32(buffer->Packet, buffer->Length, DHCP_MAGIC);

        // Add options
        // 1     DHCPDISCOVER
        // 2     DHCPOFFER
        // 3     DHCPREQUEST
        // 4     DHCPDECLINE
        // 5     DHCPACK
        // 6     DHCPNAK
        // 7     DHCPRELEASE
        buffer->Packet[buffer->Length++] = 53;
        buffer->Packet[buffer->Length++] = 1;
        buffer->Packet[buffer->Length++] = messageType;

        if (requestAddress != nullptr)
        {
            buffer->Packet[buffer->Length++] = 50;
            buffer->Packet[buffer->Length++] = 4; // length
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = requestAddress[i];
            }
        }

        if (serverAddress != nullptr)
        {
            // server address
            buffer->Packet[buffer->Length++] = 54;
            buffer->Packet[buffer->Length++] = 5; // length
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = serverAddress[i]; // (Server IP address)
            }
        }

        buffer->Packet[buffer->Length++] = 255; // End options

        int pad = 8;
        for (i = 0; i < pad; i++)
        {
            buffer->Packet[buffer->Length++] = 0;
        }

        uint8_t sourceIP[] = {0, 0, 0, 0};
        uint8_t targetIP[] = {255, 255, 255, 255};
        UDP.Transmit(buffer, targetIP, 67, sourceIP, 68);
    }
}